

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  Mat *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 uVar8;
  long *plVar9;
  undefined8 uVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  byte bVar14;
  int k_2;
  int iVar15;
  _func_int **pp_Var16;
  Layer *pLVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  uint _c;
  int iVar21;
  ulong uVar22;
  byte bVar23;
  int k;
  ulong uVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  undefined4 *puVar28;
  ulong uVar29;
  undefined4 *puVar30;
  _func_int *p_Var31;
  long lVar32;
  int k_1;
  undefined4 *puVar33;
  uint _w;
  void *pvVar34;
  _func_int **pp_Var35;
  long lVar36;
  long lVar37;
  int p;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int k_3;
  int iVar42;
  _func_int **pp_Var43;
  long lVar44;
  long lVar45;
  int i;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  uint uVar50;
  int iVar51;
  long lVar52;
  ulong uVar53;
  _func_int **pp_Var54;
  long lVar55;
  long lVar56;
  uint local_1c8;
  ParamDict pd_6;
  ParamDict pd;
  undefined4 local_188;
  undefined4 uStack_184;
  int local_180;
  Allocator *local_178;
  int iStack_170;
  int iStack_16c;
  int iStack_168;
  int iStack_164;
  int local_160 [2];
  size_t local_158 [2];
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined8 local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined8 local_110;
  _func_int *local_100;
  long local_f8;
  void *local_f0;
  ParamDict pd_5;
  ModelBinFromMatArray local_58;
  int local_44;
  long local_40;
  long local_38;
  
  pp_Var16 = this->_vptr_Convolution_x86;
  p_Var31 = pp_Var16[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var31) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var31)) {
  case 1:
    pLVar17 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 2:
    pLVar17 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var31));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 3:
    pLVar17 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var31));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var31) + 4));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 4:
    pLVar17 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 5:
    pLVar17 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  case 6:
    pLVar17 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var31));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var31) + 4));
    (*pLVar17->_vptr_Layer[2])(pLVar17,&pd);
    break;
  default:
    pLVar17 = (Layer *)0x0;
    goto LAB_0019291a;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar17->_vptr_Layer[4])(pLVar17,opt);
  pp_Var16 = this->_vptr_Convolution_x86;
LAB_0019291a:
  this->activation = pLVar17;
  this->nT = opt->num_threads;
  p_Var31 = pp_Var16[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)p_Var31) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar48 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var31);
  iVar51 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var31);
  iVar21 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var31);
  uVar46 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var31 + 4)) /
           (long)(iVar21 * iVar51);
  uVar46 = (long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff) /
           (long)(int)uVar48;
  uVar22 = uVar46 & 0xffffffff;
  bVar13 = opt->use_packing_layout;
  if ((((iVar51 == iVar21 && bVar13 == false) &&
       (iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var31), iVar42 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var31) == iVar42)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var31) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var31) == 1)))) {
    pLVar17 = create_layer(6);
    this->convolution_dilation1 = pLVar17;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var16 = this->_vptr_Convolution_x86;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var16[-3]) == 0) {
      local_158[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_184 = 0;
      local_180 = 0;
      local_178 = (Allocator *)0x0;
      iStack_170 = 0;
      iStack_16c = 0;
      iStack_168 = 0;
      iStack_164 = 0;
      local_160[0] = 0;
      p_Var31 = pp_Var16[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31)) {
        piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var31);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var31);
        uVar8 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var31);
        pd.d._0_4_ = (undefined4)uVar8;
        pd.d._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        uStack_184 = (undefined4)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->weight_winograd63_data).c + (long)p_Var31) >> 0x20);
        local_180 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var31);
        local_178 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var31);
        uVar8 = *(undefined8 *)((long)&this->gemm + (long)p_Var31);
        uVar10 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var31);
        iStack_170 = (int)uVar8;
        iStack_16c = (int)((ulong)uVar8 >> 0x20);
        iStack_168 = (int)uVar10;
        iStack_164 = (int)((ulong)uVar10 >> 0x20);
        local_160[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var31);
        local_158[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var31);
      }
      pLVar17 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar17->_vptr_Layer[3])(pLVar17,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_178 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_178->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_158[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_184 = 0;
      local_180 = 0;
      local_178 = (Allocator *)0x0;
      iStack_170 = 0;
      iStack_16c = 0;
      iStack_168 = 0;
      iStack_164 = 0;
      local_160[0] = 0;
      p_Var31 = pp_Var16[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31)) {
        piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var31);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var31);
        uVar8 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var31);
        pd.d._0_4_ = (undefined4)uVar8;
        pd.d._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        uStack_184 = (undefined4)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->weight_winograd63_data).c + (long)p_Var31) >> 0x20);
        local_180 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var31);
        local_178 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var31);
        iStack_170 = *(int *)((long)&this->gemm + (long)p_Var31);
        iStack_16c = *(int *)((long)&this->gemm + (long)(p_Var31 + 4));
        iStack_168 = *(int *)((long)&(this->scale_in_data).data + (long)p_Var31);
        iStack_164 = *(int *)((long)&(this->scale_in_data).data + (long)(p_Var31 + 4));
        local_160[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var31);
        local_158[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var31);
        p_Var31 = this->_vptr_Convolution_x86[-3];
      }
      local_110 = 0;
      local_118 = 0;
      uStack_11c = 0;
      uStack_120 = 0;
      uStack_124 = 0;
      uStack_128 = 0;
      local_130 = 0;
      local_138 = 0;
      uStack_13c = 0;
      local_140 = 0;
      uStack_144 = 0;
      uStack_148 = 0;
      local_158[1] = 0;
      if ((_func_int *)(local_158 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var31)) {
        piVar4 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var31);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        local_158[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var31);
        uVar8 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var31);
        uStack_148 = (undefined4)uVar8;
        uStack_144 = (undefined4)((ulong)uVar8 >> 0x20);
        uVar8 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var31);
        local_140 = (undefined4)uVar8;
        uStack_13c = (undefined4)((ulong)uVar8 >> 0x20);
        local_138 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var31);
        local_130 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var31);
        uVar8 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var31);
        uStack_128 = (undefined4)uVar8;
        uStack_124 = (undefined4)((ulong)uVar8 >> 0x20);
        uStack_120 = (undefined4)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var31);
        uStack_11c = (undefined4)
                     ((ulong)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var31) >> 0x20);
        local_118 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var31);
        local_110 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var31);
      }
      pLVar17 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar17->_vptr_Layer[3])(pLVar17,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar32 = 0x48;
      do {
        piVar4 = *(int **)((long)&pd.d + lVar32);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (*(long **)((long)&local_178 + lVar32) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar32));
            }
            else {
              (**(code **)(**(long **)((long)&local_178 + lVar32) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_158 + lVar32) = 0;
        *(undefined8 *)((long)&pd.d + lVar32 + 4) = 0;
        *(undefined8 *)((long)&uStack_184 + lVar32) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar32) = 0;
        *(undefined8 *)((long)&pd.d + lVar32) = 0;
        *(undefined4 *)((long)local_160 + lVar32) = 0;
        *(undefined8 *)((long)&iStack_170 + lVar32) = 0;
        *(undefined8 *)((long)&iStack_168 + lVar32) = 0;
        lVar32 = lVar32 + -0x48;
      } while (lVar32 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var31 = this->_vptr_Convolution_x86[-3];
      piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var31);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          plVar9 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var31);
          if (plVar9 == (long *)0x0) {
            free(*(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var31));
          }
          else {
            (**(code **)(*plVar9 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var31) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var31) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var31) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var31) = 0;
      *(undefined8 *)((long)&this->gemm + (long)p_Var31) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var31) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var31) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  if (bVar13 == false) {
    uVar50 = 1;
  }
  else {
    uVar50 = (uint)((uVar46 & 3) == 0) * 3 + 1;
  }
  bVar23 = opt->use_winograd23_convolution;
  local_1c8 = (uint)uVar46;
  if ((((bool)bVar23 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar11 = false;
  }
  else {
    bVar11 = 8 < (int)uVar48 || 8 < (int)local_1c8;
  }
  if (((((iVar21 != 3) || (iVar51 != 3)) || (opt->use_winograd_convolution == false)) ||
      ((!bVar11 || (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var31) != 1)))) ||
     ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var31) != 1 ||
      ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var31) != 1 ||
       (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var31) != 1)))))) {
    iVar15 = get_cpu_level2_cache_size();
    local_100 = this->_vptr_Convolution_x86[-3];
    _c = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)local_100);
    iVar51 = *(int *)((long)&(this->weight_winograd23_data).w + (long)local_100);
    iVar21 = *(int *)((long)&(this->weight_winograd23_data).h + (long)local_100);
    iVar42 = *(int *)((long)&(this->weight_winograd23_data).d + (long)local_100);
    iVar38 = *(int *)((long)&(this->weight_winograd23_data).c + (long)local_100);
    iVar2 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)local_100);
    iVar3 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)local_100);
    lVar32 = (long)(int)local_1c8;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar15 < (int)(_c * iVar51 * iVar21 * iVar42 * iVar38 * iVar2 * iVar3 * local_1c8 * 8) ||
         (0x10 < (int)local_1c8 || 0x10 < (int)_c))) || (iVar21 == 1 && iVar51 == 1)) {
      pLVar17 = create_layer(0x4a);
      this->gemm = pLVar17;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar48 = iVar21 * iVar51;
      ParamDict::set(&pd_6,9,local_1c8 * uVar48);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86[-3]) == 0) | 1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      this_00 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86[-3]);
      Mat::reshape((Mat *)&pd,this_00,uVar48,local_1c8,*(int *)&this_00[-2].data,(Allocator *)0x0);
      lVar27 = 0;
      Mat::create((Mat *)&pd_5,local_1c8 * uVar48,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86[-3]),4,(Allocator *)0x0);
      pp_Var16 = this->_vptr_Convolution_x86;
      if ((int)uVar48 < 1) {
        uVar48 = 0;
      }
      for (; lVar27 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var16[-3]);
          lVar27 = lVar27 + 1) {
        pp_Var35 = pd_5._vptr_ParamDict;
        for (lVar39 = 0; lVar39 < (long)(lVar32 - (ulong)(uVar50 - 1));
            lVar39 = lVar39 + (ulong)uVar50) {
          pp_Var43 = (_func_int **)
                     ((iStack_16c * lVar39 + local_158[0] * lVar27) * CONCAT44(uStack_184,local_188)
                     + (long)pd._vptr_ParamDict);
          for (uVar46 = 0; pp_Var54 = pp_Var43, uVar22 = (ulong)uVar50, uVar46 != uVar48;
              uVar46 = uVar46 + 1) {
            while (uVar22 != 0) {
              *(undefined4 *)pp_Var35 = *(undefined4 *)pp_Var54;
              pp_Var35 = (_func_int **)((long)pp_Var35 + 4);
              pp_Var54 = (_func_int **)
                         ((long)pp_Var54 + CONCAT44(uStack_184,local_188) * (long)iStack_16c);
              uVar22 = uVar22 - 1;
            }
            pp_Var43 = (_func_int **)((long)pp_Var43 + 4);
          }
        }
      }
      piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_178 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_178->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86[-3]) == 0) {
        piVar4 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        uStack_184 = 0;
        local_180 = 0;
        local_178 = (Allocator *)0x0;
        iStack_170 = 0;
        iStack_16c = 0;
        iStack_168 = 0;
        iStack_164 = 0;
        local_160[0] = 0;
        local_158[0] = 0;
        pLVar17 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_58,(Mat *)&pd);
        (*pLVar17->_vptr_Layer[3])(pLVar17,&local_58);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_58);
        piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_178 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        piVar4 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        local_110 = 0;
        local_118 = 0;
        uStack_11c = 0;
        uStack_120 = 0;
        uStack_124 = 0;
        uStack_128 = 0;
        local_130 = 0;
        local_138 = 0;
        uStack_13c = 0;
        local_140 = 0;
        uStack_144 = 0;
        uStack_148 = 0;
        local_158[1] = 0;
        p_Var31 = this->_vptr_Convolution_x86[-3];
        if ((_func_int *)(local_158 + 1) !=
            (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var31)) {
          piVar4 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var31);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          local_158[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var31);
          uVar8 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var31);
          uStack_148 = (undefined4)uVar8;
          uStack_144 = (undefined4)((ulong)uVar8 >> 0x20);
          uVar8 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var31);
          local_140 = (undefined4)uVar8;
          uStack_13c = (undefined4)((ulong)uVar8 >> 0x20);
          local_138 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var31);
          local_130 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var31);
          uVar8 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var31);
          uStack_128 = (undefined4)uVar8;
          uStack_124 = (undefined4)((ulong)uVar8 >> 0x20);
          uStack_120 = (undefined4)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var31);
          uStack_11c = (undefined4)
                       ((ulong)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var31) >> 0x20);
          local_118 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var31);
          local_110 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var31);
        }
        local_158[0] = 0;
        local_160[0] = 0;
        iStack_164 = 0;
        iStack_168 = 0;
        iStack_16c = 0;
        iStack_170 = 0;
        local_178 = (Allocator *)0x0;
        local_180 = 0;
        uStack_184 = 0;
        pd.d._4_4_ = pd_5.d._4_4_;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pLVar17 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_58,(Mat *)&pd);
        (*pLVar17->_vptr_Layer[3])(pLVar17,&local_58);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_58);
        lVar32 = 0x48;
        do {
          piVar4 = *(int **)((long)&pd.d + lVar32);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (*(long **)((long)&local_178 + lVar32) == (long *)0x0) {
                free(*(void **)((long)&pd._vptr_ParamDict + lVar32));
              }
              else {
                (**(code **)(**(long **)((long)&local_178 + lVar32) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)local_158 + lVar32) = 0;
          *(undefined8 *)((long)&pd.d + lVar32 + 4) = 0;
          *(undefined8 *)((long)&uStack_184 + lVar32) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar32) = 0;
          *(undefined8 *)((long)&pd.d + lVar32) = 0;
          *(undefined4 *)((long)local_160 + lVar32) = 0;
          *(undefined8 *)((long)&iStack_170 + lVar32) = 0;
          *(undefined8 *)((long)&iStack_168 + lVar32) = 0;
          lVar32 = lVar32 + -0x48;
        } while (lVar32 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar4 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          free(pd_5._vptr_ParamDict);
        }
      }
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      local_100 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)local_100);
      uVar46 = (ulong)(int)_c;
      if (((((bVar13 != false && (uVar48 & 3) == 0) && uVar50 == 1) && (iVar51 == 3)) &&
          (iVar21 == 3)) && ((iVar42 == 1 && (iVar38 == 1)))) {
        if (iVar2 == 2) {
          if (iVar3 == 2) goto LAB_00193333;
        }
        else if ((iVar2 == 1) && (iVar3 == 1)) {
LAB_00193333:
          Mat::reshape((Mat *)&pd,(Mat *)(local_100 + 0x160),9,local_1c8,_c,(Allocator *)0x0);
          Mat::create(&this->weight_data_tm,9,local_1c8,(int)_c / 4,0x10,4,(Allocator *)0x0);
          pvVar5 = (this->weight_data_tm).data;
          sVar6 = (this->weight_data_tm).elemsize;
          sVar7 = (this->weight_data_tm).cstep;
          for (lVar27 = 0; lVar27 < (long)(uVar46 - 3); lVar27 = lVar27 + 4) {
            pvVar34 = (void *)((long)((int)lVar27 >> 2) * sVar6 * sVar7 + (long)pvVar5);
            for (lVar39 = 0; lVar39 < lVar32; lVar39 = lVar39 + 1) {
              lVar40 = 0;
              for (lVar18 = 0; lVar18 != 9; lVar18 = lVar18 + 1) {
                lVar37 = lVar39;
                for (lVar44 = 0; lVar44 != 1; lVar44 = lVar44 + 1) {
                  puVar28 = (undefined4 *)
                            ((long)pd._vptr_ParamDict +
                            (iStack_16c * lVar37 + lVar27 * local_158[0]) *
                            CONCAT44(uStack_184,local_188) + lVar40);
                  for (lVar45 = 0; lVar45 != 0x10; lVar45 = lVar45 + 4) {
                    *(undefined4 *)((long)pvVar34 + lVar45) = *puVar28;
                    puVar28 = (undefined4 *)
                              ((long)puVar28 + CONCAT44(uStack_184,local_188) * local_158[0]);
                  }
                  lVar37 = lVar37 + 1;
                  pvVar34 = (void *)((long)pvVar34 + 0x10);
                }
                lVar40 = lVar40 + 4;
              }
            }
          }
          piVar4 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_178 == (Allocator *)0x0) {
                free(pd._vptr_ParamDict);
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          goto LAB_001935f1;
        }
      }
      uVar50 = iVar21 * iVar51;
      uVar48 = local_1c8;
      if ((int)_c < 4) {
        if ((int)_c < 2) {
          if ((int)local_1c8 < 4) {
            _w = uVar50;
            if (1 < (int)local_1c8) {
              _w = uVar50 * 2;
              uVar48 = (local_1c8 & 1) + 1;
            }
          }
          else {
            _w = uVar50 * 4;
            uVar48 = (local_1c8 & 1) + (int)(uVar22 >> 2) + (uint)((local_1c8 >> 1 & 1) != 0);
          }
        }
        else if ((int)local_1c8 < 4) {
          if ((int)local_1c8 < 2) {
            _w = uVar50 * 2;
            _c = (_c & 1) + 1;
          }
          else {
            _w = uVar50 * 4;
            uVar48 = (local_1c8 & 1) + 1;
            _c = (_c & 1) + 1;
          }
        }
        else {
          _w = uVar50 * 8;
          uVar48 = (local_1c8 & 1) + (int)(uVar22 >> 2) + (uint)((local_1c8 >> 1 & 1) != 0);
          _c = (_c & 1) + 1;
        }
      }
      else if ((int)local_1c8 < 4) {
        if ((int)local_1c8 < 2) {
          _c = (_c & 1) + ((uint)(uVar46 >> 2) & 0x3fffffff) + (uint)((_c >> 1 & 1) != 0);
          _w = uVar50 * 4;
        }
        else {
          _w = uVar50 * 8;
          uVar48 = (local_1c8 & 1) + 1;
          _c = (_c & 1) + (_c >> 2) + (uint)((_c >> 1 & 1) != 0);
        }
      }
      else {
        _w = uVar50 * 0x10;
        uVar48 = (local_1c8 & 1) + (int)(uVar22 >> 2) + (uint)((local_1c8 >> 1 & 1) != 0);
        _c = (_c & 1) + ((uint)(uVar46 >> 2) & 0x3fffffff) + (uint)((_c >> 1 & 1) != 0);
      }
      Mat::create(&this->weight_data_tm,_w,uVar48,_c,4,(Allocator *)0x0);
      lVar27 = *(long *)(local_100 + 0x160);
      pvVar5 = (this->weight_data_tm).data;
      local_38 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
      local_40 = (long)(int)uVar50;
      iVar51 = 0;
      uVar22 = 0;
      if (0 < (int)uVar50) {
        uVar22 = (ulong)uVar50;
      }
      iVar38 = uVar50 * local_1c8;
      local_44 = iVar38 * 4;
      iVar21 = iVar38 * 3;
      lVar18 = local_40 * 0x10;
      lVar39 = local_40 * 4;
      iVar42 = iVar38 * 2;
      lVar40 = local_40 * 8;
      for (uVar29 = 0; (long)(uVar29 | 3) < (long)uVar46; uVar29 = uVar29 + 4) {
        lVar37 = lVar27 + (long)iVar38 * 4;
        lVar44 = lVar27 + (long)iVar42 * 4;
        lVar45 = lVar27 + (long)iVar21 * 4;
        lVar55 = lVar27 + (long)iVar51 * 4;
        puVar28 = (undefined4 *)((uVar29 >> 2) * local_38 + (long)pvVar5);
        lVar25 = 0;
        lVar41 = lVar44;
        lVar47 = lVar37;
        lVar49 = lVar45;
        lVar56 = lVar55;
        for (uVar53 = 0; (long)(uVar53 | 3) < lVar32; uVar53 = uVar53 + 4) {
          lVar52 = lVar25;
          for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
            lVar36 = lVar52;
            for (lVar19 = 0; (int)lVar19 != 0x40; lVar19 = lVar19 + 0x10) {
              *(undefined4 *)((long)puVar28 + lVar19) = *(undefined4 *)(lVar55 + lVar36);
              *(undefined4 *)((long)puVar28 + lVar19 + 4) = *(undefined4 *)(lVar37 + lVar36);
              *(undefined4 *)((long)puVar28 + lVar19 + 8) = *(undefined4 *)(lVar44 + lVar36);
              *(undefined4 *)((long)puVar28 + lVar19 + 0xc) = *(undefined4 *)(lVar45 + lVar36);
              lVar36 = lVar36 + lVar39;
            }
            lVar52 = lVar52 + 4;
            puVar28 = (undefined4 *)((long)puVar28 + lVar19);
          }
          lVar25 = lVar25 + lVar18;
          lVar47 = lVar47 + lVar18;
          lVar41 = lVar41 + lVar18;
          lVar49 = lVar49 + lVar18;
          lVar56 = lVar56 + lVar18;
        }
        for (; (long)(uVar53 | 1) < lVar32; uVar53 = uVar53 + 2) {
          lVar37 = lVar56;
          lVar44 = lVar49;
          lVar45 = lVar41;
          lVar55 = lVar47;
          for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
            lVar25 = 0;
            for (lVar52 = 0; (int)lVar52 != 0x20; lVar52 = lVar52 + 0x10) {
              *(undefined4 *)((long)puVar28 + lVar52) = *(undefined4 *)(lVar37 + lVar25);
              *(undefined4 *)((long)puVar28 + lVar52 + 4) = *(undefined4 *)(lVar55 + lVar25);
              *(undefined4 *)((long)puVar28 + lVar52 + 8) = *(undefined4 *)(lVar45 + lVar25);
              *(undefined4 *)((long)puVar28 + lVar52 + 0xc) = *(undefined4 *)(lVar44 + lVar25);
              lVar25 = lVar25 + lVar39;
            }
            lVar55 = lVar55 + 4;
            lVar45 = lVar45 + 4;
            lVar44 = lVar44 + 4;
            lVar37 = lVar37 + 4;
            puVar28 = (undefined4 *)((long)puVar28 + lVar52);
          }
          lVar47 = lVar47 + lVar40;
          lVar41 = lVar41 + lVar40;
          lVar49 = lVar49 + lVar40;
          lVar56 = lVar56 + lVar40;
        }
        for (; (long)uVar53 < lVar32; uVar53 = uVar53 + 1) {
          for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
            *puVar28 = *(undefined4 *)(lVar56 + uVar24 * 4);
            puVar28[1] = *(undefined4 *)(lVar47 + uVar24 * 4);
            puVar28[2] = *(undefined4 *)(lVar41 + uVar24 * 4);
            puVar28[3] = *(undefined4 *)(lVar49 + uVar24 * 4);
            puVar28 = puVar28 + 4;
          }
          lVar49 = lVar49 + lVar39;
          lVar41 = lVar41 + lVar39;
          lVar47 = lVar47 + lVar39;
          lVar56 = lVar56 + lVar39;
        }
        iVar51 = iVar51 + local_44;
        iVar38 = iVar38 + local_44;
        iVar21 = iVar21 + local_44;
        iVar42 = iVar42 + local_44;
      }
      lVar45 = *(long *)(local_100 + 0x160);
      pvVar5 = (this->weight_data_tm).data;
      sVar6 = (this->weight_data_tm).elemsize;
      sVar7 = (this->weight_data_tm).cstep;
      iVar21 = local_1c8 * uVar50 * 2;
      lVar27 = lVar45 + (long)(int)(uVar50 * 3) * 4;
      lVar37 = lVar45 + (long)(int)(uVar50 * 2) * 4;
      lVar44 = lVar45 + local_40 * 4;
      for (; (long)(uVar29 | 1) < (long)uVar46; uVar29 = uVar29 + 2) {
        lVar49 = (long)iVar38;
        lVar55 = lVar27 + lVar49 * 4;
        lVar41 = lVar37 + lVar49 * 4;
        lVar47 = lVar44 + lVar49 * 4;
        lVar49 = lVar45 + lVar49 * 4;
        lVar36 = (long)iVar51;
        lVar56 = lVar27 + lVar36 * 4;
        lVar25 = lVar37 + lVar36 * 4;
        lVar52 = lVar44 + lVar36 * 4;
        lVar36 = lVar45 + lVar36 * 4;
        puVar28 = (undefined4 *)
                  ((ulong)(((uint)(uVar29 >> 2) & 0x3fffffff) + (uint)(((uint)uVar29 >> 1 & 1) != 0)
                          ) * sVar6 * sVar7 + (long)pvVar5);
        for (uVar53 = 0; (long)(uVar53 | 3) < lVar32; uVar53 = uVar53 + 4) {
          puVar30 = puVar28;
          for (lVar19 = 0; uVar22 * 4 - lVar19 != 0; lVar19 = lVar19 + 4) {
            puVar28[lVar19 * 2] = *(undefined4 *)(lVar36 + lVar19);
            puVar28[lVar19 * 2 + 1] = *(undefined4 *)(lVar52 + lVar19);
            puVar28[lVar19 * 2 + 2] = *(undefined4 *)(lVar25 + lVar19);
            puVar28[lVar19 * 2 + 3] = *(undefined4 *)(lVar56 + lVar19);
            puVar28[lVar19 * 2 + 4] = *(undefined4 *)(lVar49 + lVar19);
            puVar28[lVar19 * 2 + 5] = *(undefined4 *)(lVar47 + lVar19);
            puVar28[lVar19 * 2 + 6] = *(undefined4 *)(lVar41 + lVar19);
            puVar28[lVar19 * 2 + 7] = *(undefined4 *)(lVar55 + lVar19);
            puVar30 = puVar30 + 8;
          }
          lVar55 = lVar55 + lVar18;
          lVar41 = lVar41 + lVar18;
          lVar47 = lVar47 + lVar18;
          lVar49 = lVar49 + lVar18;
          lVar56 = lVar56 + lVar18;
          lVar25 = lVar25 + lVar18;
          lVar52 = lVar52 + lVar18;
          lVar36 = lVar36 + lVar18;
          puVar28 = puVar30;
        }
        for (; (long)(uVar53 | 1) < lVar32; uVar53 = uVar53 + 2) {
          lVar55 = lVar36;
          lVar41 = lVar49;
          for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
            lVar56 = 0;
            for (lVar47 = 0; (int)lVar47 != 0x10; lVar47 = lVar47 + 8) {
              *(undefined4 *)((long)puVar28 + lVar47) = *(undefined4 *)(lVar55 + lVar56);
              *(undefined4 *)((long)puVar28 + lVar47 + 4) = *(undefined4 *)(lVar41 + lVar56);
              lVar56 = lVar56 + lVar39;
            }
            puVar28 = (undefined4 *)((long)puVar28 + lVar47);
            lVar55 = lVar55 + 4;
            lVar41 = lVar41 + 4;
          }
          lVar36 = lVar36 + lVar40;
          lVar49 = lVar49 + lVar40;
        }
        for (; (long)uVar53 < lVar32; uVar53 = uVar53 + 1) {
          for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
            *puVar28 = *(undefined4 *)(lVar36 + uVar24 * 4);
            puVar28[1] = *(undefined4 *)(lVar49 + uVar24 * 4);
            puVar28 = puVar28 + 2;
          }
          lVar49 = lVar49 + lVar39;
          lVar36 = lVar36 + lVar39;
        }
        iVar51 = iVar51 + iVar21;
        iVar38 = iVar38 + iVar21;
      }
      lVar27 = *(long *)(local_100 + 0x160);
      local_f0 = (this->weight_data_tm).data;
      sVar6 = (this->weight_data_tm).elemsize;
      sVar7 = (this->weight_data_tm).cstep;
      local_f8 = lVar27 + local_40 * 4;
      for (; (long)uVar29 < (long)uVar46; uVar29 = uVar29 + 1) {
        lVar39 = local_f8 + (long)iVar51 * 4;
        puVar28 = (undefined4 *)(lVar27 + (long)iVar51 * 4);
        puVar30 = (undefined4 *)
                  ((ulong)(((uint)uVar29 & 1) + ((uint)(uVar29 >> 2) & 0x3fffffff) +
                          (uint)(((uint)uVar29 >> 1 & 1) != 0)) * sVar6 * sVar7 + (long)local_f0);
        for (uVar53 = 0; (long)(uVar53 | 3) < lVar32; uVar53 = uVar53 + 4) {
          puVar26 = puVar28;
          for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
            puVar33 = puVar26;
            for (lVar37 = 0; (int)lVar37 != 0x10; lVar37 = lVar37 + 4) {
              *(undefined4 *)((long)puVar30 + lVar37) = *puVar33;
              puVar33 = puVar33 + local_40;
            }
            puVar30 = (undefined4 *)((long)puVar30 + lVar37);
            puVar26 = puVar26 + 1;
          }
          puVar28 = puVar28 + local_40 * 4;
          lVar39 = lVar39 + lVar18;
        }
        for (; (long)(uVar53 | 1) < lVar32; uVar53 = uVar53 + 2) {
          for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
            *puVar30 = puVar28[uVar24];
            puVar30[1] = *(undefined4 *)(lVar39 + uVar24 * 4);
            puVar30 = puVar30 + 2;
          }
          lVar39 = lVar39 + lVar40;
          puVar28 = puVar28 + local_40 * 2;
        }
        for (; (long)uVar53 < lVar32; uVar53 = uVar53 + 1) {
          for (lVar39 = 0; uVar22 * 4 - lVar39 != 0; lVar39 = lVar39 + 4) {
            *(undefined4 *)((long)puVar30 + lVar39) = *(undefined4 *)((long)puVar28 + lVar39);
          }
          puVar28 = puVar28 + local_40;
          puVar30 = (undefined4 *)((long)puVar30 + lVar39);
        }
        iVar51 = iVar51 + local_1c8 * uVar50;
      }
    }
LAB_001935f1:
    cVar1 = opt->lightmode;
    goto LAB_001935f9;
  }
  lVar32 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var31);
  if (((lVar32 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var31)) ||
      (*(int *)(lVar32 + 0x2c) == 0)) || (*(int *)(lVar32 + 0x30) == 0)) {
    lVar27 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var31);
    lVar39 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var31);
    if (((lVar27 != lVar39) && (*(int *)(lVar27 + 0x2c) != 0)) && (*(int *)(lVar27 + 0x30) != 0))
    goto LAB_0019370f;
    if ((((int)uVar48 < 0x21) && (opt->use_winograd63_convolution != false)) &&
       ((int)local_1c8 < 0x21)) {
LAB_00194165:
      conv3x3s1_winograd63_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31),
                 &this->weight_winograd63_data,local_1c8,uVar48,opt);
    }
    else {
      if (opt->use_winograd43_convolution != true) goto LAB_00194152;
LAB_00194118:
      conv3x3s1_winograd43_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31),
                 &this->weight_winograd43_data,local_1c8,uVar48,opt);
    }
  }
  else {
    lVar27 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var31);
    lVar39 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var31);
LAB_0019370f:
    if (((lVar27 == lVar39) || (iVar51 = *(int *)(lVar27 + 0x2c), iVar51 == 0)) ||
       (iVar21 = *(int *)(lVar27 + 0x30), iVar21 == 0)) {
      iVar51 = *(int *)(lVar32 + 0x2c);
      iVar21 = *(int *)(lVar32 + 0x30);
      iVar42 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var31 + 4));
      iVar38 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var31);
      if (((iVar38 < 1 && iVar42 < 1) &&
          (iVar2 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var31 + 4)),
          iVar2 < 1)) &&
         (iVar3 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var31),
         iVar3 < 1)) {
        if ((iVar3 == -0xe9 && (iVar2 == -0xe9 && (iVar38 == -0xe9 && iVar42 == -0xe9))) ||
           (iVar3 == -0xea && (iVar2 == -0xea && (iVar38 == -0xea && iVar42 == -0xea))))
        goto LAB_00193730;
      }
      else {
        iVar51 = iVar42 + iVar51 + iVar38;
        iVar21 = iVar21 + *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var31 + 4))
                 + *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var31);
      }
    }
    else {
LAB_00193730:
      iVar51 = iVar51 + 2;
      iVar21 = iVar21 + 2;
    }
    bVar12 = test_prefer_winograd63(local_1c8,uVar48,iVar51,iVar21);
    bVar13 = test_prefer_winograd23(local_1c8,uVar48,iVar51,iVar21);
    bVar20 = bVar13 & bVar23;
    if (!bVar13) {
      bVar23 = bVar12;
    }
    if ((bool)bVar12) {
      bVar14 = opt->use_winograd63_convolution;
      if ((bVar23 & bVar14) != 0) goto LAB_001940b9;
LAB_001940e7:
      if (opt->use_winograd43_convolution == false) {
        if (bVar20 != 0 || opt->use_winograd63_convolution != true) goto LAB_00194152;
        bVar12 = bVar14 | opt->use_winograd63_convolution;
        goto LAB_0019415e;
      }
      if (bVar20 == 0) goto LAB_00194118;
    }
    else {
      if (bVar23 == 0) {
        bVar14 = 0;
        goto LAB_001940e7;
      }
LAB_001940b9:
      if (bVar20 == 0) {
LAB_0019415e:
        if (bVar12 != 0) goto LAB_00194165;
        goto LAB_0019418a;
      }
    }
LAB_00194152:
    conv3x3s1_winograd23_transform_kernel
              ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31),
               &this->weight_winograd23_data,local_1c8,uVar48,opt);
  }
LAB_0019418a:
  cVar1 = opt->lightmode;
LAB_001935f9:
  if (cVar1 == '\x01') {
    p_Var31 = this->_vptr_Convolution_x86[-3];
    piVar4 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var31);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        plVar9 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var31);
        if (plVar9 == (long *)0x0) {
          free(*(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var31));
        }
        else {
          (**(code **)(*plVar9 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var31) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var31) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var31) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var31) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var31) = 0;
    *(undefined8 *)((long)&this->gemm + (long)p_Var31) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var31) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var31) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}